

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

bool __thiscall wallet::CWallet::Unlock(CWallet *this,CKeyingMaterial *vMasterKeyIn)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  pointer pSVar4;
  AnnotatedMixin<std::recursive_mutex> *in_RSI;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_RDI;
  long in_FS_OFFSET;
  vector<unsigned_char,_secure_allocator<unsigned_char>_> *in_stack_00000020;
  pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>
  *spk_man_pair;
  map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
  *__range2;
  iterator __end2;
  iterator __begin2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock65;
  signal<void_(wallet::CWallet_*),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(wallet::CWallet_*)>,_boost::function<void_(const_boost::signals2::connection_&,_wallet::CWallet_*)>,_boost::signals2::mutex>
  *in_stack_ffffffffffffff88;
  undefined6 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 in_stack_ffffffffffffff97;
  undefined1 in_stack_ffffffffffffffab;
  int in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *this_00;
  byte local_29;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff88);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (this_00,in_RSI,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffac,(bool)in_stack_ffffffffffffffab);
  std::
  map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
  ::begin((map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
           *)CONCAT17(in_stack_ffffffffffffff97,
                      CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)));
  std::
  map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
  ::end((map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
         *)CONCAT17(in_stack_ffffffffffffff97,
                    CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)));
  do {
    bVar2 = std::operator==((_Self *)in_RDI,
                            (_Self *)CONCAT17(in_stack_ffffffffffffff97,
                                              CONCAT16(in_stack_ffffffffffffff96,
                                                       in_stack_ffffffffffffff90)));
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)spk_man_pair,
                 in_stack_00000020);
      bVar2 = false;
LAB_001a65eb:
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff88);
      if (!bVar2) {
        boost::signals2::
        signal<void_(wallet::CWallet_*),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(wallet::CWallet_*)>,_boost::function<void_(const_boost::signals2::connection_&,_wallet::CWallet_*)>,_boost::signals2::mutex>
        ::operator()(in_stack_ffffffffffffff88,(CWallet *)0x1a6615);
        local_29 = 1;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return (bool)(local_29 & 1);
    }
    std::
    _Rb_tree_iterator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>
                 *)in_stack_ffffffffffffff88);
    pSVar4 = std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
             ::operator->((unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
                           *)in_stack_ffffffffffffff88);
    uVar3 = (*pSVar4->_vptr_ScriptPubKeyMan[4])(pSVar4,in_RSI);
    in_stack_ffffffffffffff97 = (undefined1)uVar3;
    if ((uVar3 & 1) == 0) {
      local_29 = 0;
      bVar2 = true;
      goto LAB_001a65eb;
    }
    std::
    _Rb_tree_iterator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>
                  *)in_stack_ffffffffffffff88);
  } while( true );
}

Assistant:

bool CWallet::Unlock(const CKeyingMaterial& vMasterKeyIn)
{
    {
        LOCK(cs_wallet);
        for (const auto& spk_man_pair : m_spk_managers) {
            if (!spk_man_pair.second->CheckDecryptionKey(vMasterKeyIn)) {
                return false;
            }
        }
        vMasterKey = vMasterKeyIn;
    }
    NotifyStatusChanged(this);
    return true;
}